

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O1

void duckdb::VectorMinMaxBase<(duckdb::OrderType)3>::Finalize<duckdb::MinMaxStringState>
               (MinMaxStringState *state,AggregateFinalizeData *finalize_data)

{
  OrderModifiers in_R9W;
  string_t sort_key;
  
  if ((state->super_MinMaxState<duckdb::string_t>).isset != false) {
    sort_key.value.pointer.ptr = (char *)finalize_data->result;
    sort_key.value._0_8_ = (state->super_MinMaxState<duckdb::string_t>).value.value.pointer.ptr;
    CreateSortKeyHelpers::DecodeSortKey
              (*(CreateSortKeyHelpers **)&(state->super_MinMaxState<duckdb::string_t>).value.value,
               sort_key,(Vector *)finalize_data->result_idx,0x303,in_R9W);
    return;
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, AggregateFinalizeData &finalize_data) {
		if (!state.isset) {
			finalize_data.ReturnNull();
		} else {
			CreateSortKeyHelpers::DecodeSortKey(state.value, finalize_data.result, finalize_data.result_idx,
			                                    OrderModifiers(ORDER_TYPE, OrderByNullType::NULLS_LAST));
		}
	}